

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControlPrivate::updateCursorBlinking(QWidgetTextControlPrivate *this)

{
  int iVar1;
  QWidgetTextControlPrivate *in_RDI;
  int in_stack_0000000c;
  int flashTime;
  undefined4 in_stack_fffffffffffffff0;
  QWidgetTextControlPrivate *this_00;
  
  this_00 = in_RDI;
  QBasicTimer::stop();
  if ((in_RDI->cursorVisible & 1U) != 0) {
    QGuiApplication::styleHints();
    iVar1 = QStyleHints::cursorFlashTime();
    if (1 < iVar1) {
      q_func(in_RDI);
      QBasicTimer::start((QBasicTimer *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_0000000c,
                         (QObject *)in_RDI);
    }
  }
  in_RDI->cursorOn = (bool)(in_RDI->cursorVisible & 1);
  repaintCursor(this_00);
  return;
}

Assistant:

void QWidgetTextControlPrivate::updateCursorBlinking()
{
    cursorBlinkTimer.stop();
    if (cursorVisible) {
        int flashTime = QGuiApplication::styleHints()->cursorFlashTime();
        if (flashTime >= 2)
            cursorBlinkTimer.start(flashTime / 2, q_func());
    }

    cursorOn = cursorVisible;
    repaintCursor();
}